

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

long boyi_search(char n_w,char n_b,char (*board) [8],char s,char f,long a,long b)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  STATE SVar5;
  long lVar6;
  byte s_00;
  char n_w_00;
  int iVar7;
  ulong unaff_RBX;
  long lVar8;
  char cVar9;
  undefined7 in_register_00000039;
  ulong unaff_R12;
  char (*pacVar10) [8];
  STATE s_01;
  long lVar11;
  char new_board [8] [8];
  byte local_dd;
  ulong local_c8;
  ulong local_b8;
  long local_b0;
  char local_a0;
  char (*local_98) [8];
  char *local_90;
  int (*local_88) [8];
  char (*local_80) [8];
  char local_78 [8];
  char acStack_70 [8];
  char local_68 [8];
  char acStack_60 [8];
  char local_58 [8];
  char acStack_50 [8];
  char local_48 [8];
  char acStack_40 [8];
  ulong local_38;
  
  if ((char)(n_b + n_w) == '@') {
    if (AI_COLOR == 4) goto LAB_001021e8;
    if (AI_COLOR == 5) goto LAB_00101d9f;
  }
  if ((MODE_DEPTH[MODE] + chess_num[1] + chess_num[0] <= (int)(char)(n_b + n_w)) &&
     (chess_num[1] + chess_num[0] <= 0x40 - MODE_DEPTH_END[MODE])) {
    return 0;
  }
  local_b8 = b;
  if (f == '\x01') {
    local_dd = s == '\x04' | 4;
    local_78 = *board;
    acStack_70 = board[1];
    local_68 = board[2];
    acStack_60 = board[3];
    local_58 = board[4];
    acStack_50 = board[5];
    local_48 = board[6];
    acStack_40 = board[7];
    if (*(char *)((long)AI_COLOR * 4 + 0x1051b4) == '\0') {
LAB_00102209:
      lVar8 = boyi_search(n_w,n_b,&local_78,local_dd,'\x02',a,b);
      return lVar8;
    }
  }
  else {
    lVar8 = 0;
    unaff_R12 = 0;
    pacVar10 = board;
    do {
      lVar11 = 0;
      do {
        if (((*pacVar10)[lVar11] & 0xfeU) != 4) {
          iVar3 = canrev((int)lVar8,(int)lVar11,board,(int)s,0);
          if (iVar3 < 1) {
            (*pacVar10)[lVar11] = '\0';
          }
          else {
            (*pacVar10)[lVar11] = s + -3;
            unaff_R12 = (ulong)(byte)((char)unaff_R12 + 1);
          }
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != 8);
      lVar8 = lVar8 + 1;
      pacVar10 = pacVar10 + 1;
    } while (lVar8 != 8);
    local_dd = s == '\x04' | 4;
    local_78 = *board;
    acStack_70 = board[1];
    local_68 = board[2];
    acStack_60 = board[3];
    local_58 = board[4];
    acStack_50 = board[5];
    local_48 = board[6];
    acStack_40 = board[7];
    unaff_RBX = 8;
    if ((char)unaff_R12 == '\0') {
      if (f != '\x02') goto LAB_00102209;
      if (AI_COLOR == 4) {
LAB_001021e8:
        lVar8 = 1000000;
        if (n_w <= n_b) {
          lVar8 = 0;
        }
        if (n_w < n_b) {
          return -1000000;
        }
        return lVar8;
      }
      if (AI_COLOR == 5) {
LAB_00101d9f:
        lVar8 = 1000000;
        if (n_b <= n_w) {
          lVar8 = 0;
        }
        if (n_b < n_w) {
          return -1000000;
        }
        return lVar8;
      }
    }
  }
  s_01 = (STATE)s;
  local_38 = (ulong)((int)CONCAT71(in_register_00000039,n_w) + 1);
  local_a0 = n_b + '\x01';
  local_b0 = 0;
  local_80 = chessboard;
  local_90 = local_78;
  local_88 = arg;
  cVar9 = '\0';
  local_c8 = a;
  local_98 = board;
  do {
    lVar8 = 0;
    do {
      iVar3 = AI_COLOR;
      if (f == '\x01') {
        if (AI_COLOR + -3 == (int)(*local_80)[lVar8] || (*local_80)[lVar8] == 3) goto LAB_00101fd3;
      }
      else if (s_01 - BOTH == (int)(*local_98)[lVar8]) {
LAB_00101fd3:
        iVar4 = canrev((int)local_b0,(int)lVar8,&local_78,s_01,1);
        local_90[lVar8] = s;
        if (cVar9 != '\0') {
          if (iVar3 == s_01) {
            if ((long)local_c8 <= (long)unaff_RBX) {
              local_c8 = unaff_RBX;
            }
          }
          else if ((long)unaff_RBX <= (long)local_b8) {
            local_b8 = unaff_RBX;
          }
        }
        iVar7 = -(*local_88)[lVar8];
        if (iVar3 == s_01) {
          iVar7 = (*local_88)[lVar8];
        }
        lVar11 = (long)iVar7;
        cVar2 = (char)iVar4;
        if (s == '\x05') {
          n_w_00 = n_w - cVar2;
          cVar2 = cVar2 + local_a0;
          s_00 = 4;
        }
        else {
          n_w_00 = (char)local_38 + cVar2;
          cVar2 = n_b - cVar2;
          s_00 = local_dd;
        }
        lVar6 = boyi_search(n_w_00,cVar2,&local_78,s_00,'\0',local_c8 - lVar11,local_b8 - lVar11);
        unaff_RBX = lVar6 + lVar11;
        SVar5 = 9 - AI_COLOR;
        if ((SVar5 == s_01) && ((long)unaff_RBX <= (long)local_c8)) {
          return local_c8;
        }
        if ((AI_COLOR == s_01) && ((long)local_b8 <= (long)unaff_RBX)) {
          return local_b8;
        }
        if ((cVar9 == '\0') || ((AI_COLOR == s_01 && ((long)unaff_R12 < (long)unaff_RBX)))) {
          unaff_R12 = unaff_RBX;
          if (f == '\x01') goto LAB_00102124;
        }
        else {
          bVar1 = (long)unaff_RBX < (long)unaff_R12;
          if (bVar1 && SVar5 == s_01) {
            unaff_R12 = unaff_RBX;
          }
          if ((f == '\x01') && (bVar1 && SVar5 == s_01)) {
LAB_00102124:
            unaff_R12 = unaff_RBX;
            boyi_max_x = (int)local_b0;
            boyi_max_y = (int)lVar8;
          }
        }
        cVar9 = cVar9 + '\x01';
        local_78 = *board;
        acStack_70 = board[1];
        local_68 = board[2];
        acStack_60 = board[3];
        local_58 = board[4];
        acStack_50 = board[5];
        local_48 = board[6];
        acStack_40 = board[7];
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 8);
    local_b0 = local_b0 + 1;
    local_98 = local_98 + 1;
    local_80 = local_80 + 1;
    local_90 = local_90 + 8;
    local_88 = local_88 + 1;
    if (local_b0 == 8) {
      return unaff_R12;
    }
  } while( true );
}

Assistant:

long boyi_search(char n_w, char n_b, char board[][SIZE], char s, char f, long a, long b) {
    char n = n_w + n_b;
    char i, j;
    if (n == SIZE * SIZE) {
        if (AI_COLOR == BLACK) {
            return (n_w > n_b ? -1000000 : (n_w < n_b ? 1000000 : 0));
        }
        if (AI_COLOR == WHITE) {
            return (n_w < n_b ? -1000000 : (n_w > n_b ? 1000000 : 0));
        }
/*#ifdef AI_COLOR_BLACK
		return (n_w > n_b ? -1000000 : (n_w < n_b ? 1000000 : 0));
#endif
#ifdef AI_COLOR_WHITE
		return (n_w < n_b ? -1000000 : (n_w > n_b ? 1000000 : 0));
#endif*/
    }
/*#if (AI_MODE==MODE_EASY)
	if (n >= chess_num[0] + chess_num[1] + 2 && chess_num[0] + chess_num[1] <= SIZE*SIZE - 3)
#elif (AI_MODE==MODE_NORM)
	if (n >= chess_num[0] + chess_num[1] + 5 && chess_num[0] + chess_num[1] <= SIZE*SIZE - 6)
#elif (AI_MODE==MODE_HARD)
	if (n >= chess_num[0] + chess_num[1] + 8 && chess_num[0] + chess_num[1] <= SIZE*SIZE - 12)
#elif (AI_MODE==MODE_HELL)
	if (n >= chess_num[0] + chess_num[1] + 10 && chess_num[0] + chess_num[1] <= SIZE*SIZE - 12)
#endif*/
    if (n >= chess_num[0] + chess_num[1] + MODE_DEPTH[MODE] &&
        chess_num[0] + chess_num[1] <= SIZE * SIZE - MODE_DEPTH_END[MODE]) {
        return 0;
    }
    char num = 0;
    if (f != 1) {
        for (i = 0; i < SIZE; i++) {
            for (j = 0; j < SIZE; j++) {
                if (board[i][j] != WHITE && board[i][j] != BLACK) {
                    if (canrev(i, j, board, s, 0) > 0) {
                        board[i][j] = s - 3;
                        num++;
                    } else {
                        board[i][j] = EMPTY;
                    }
                }
            }
        }
    } else {
        num = num_now[COLOR_bin(AI_COLOR)];
/*#ifdef AI_COLOR_BLACK
		num = num_now[1];
#endif
#ifdef AI_COLOR_WHITE
		num = num_now[0];
#endif*/
    }
    long arg_m;
    char rs = (s == WHITE ? BLACK : WHITE);
    char new_board[SIZE][SIZE];
    memcpy(new_board, board, SIZE * SIZE);
    if (num == 0) {
        if (f == 2) {
            if (AI_COLOR == BLACK) {
                return (n_w > n_b ? -1000000 : (n_w < n_b ? 1000000 : 0));
            }
            if (AI_COLOR == WHITE) {
                return (n_w < n_b ? -1000000 : (n_w > n_b ? 1000000 : 0));
            }
/*#ifdef AI_COLOR_BLACK
			return (n_w > n_b ? -1000000 : (n_w < n_b ? 1000000 : 0));
#endif
#ifdef AI_COLOR_WHITE
			return (n_w < n_b ? -1000000 : (n_w > n_b ? 1000000 : 0));
#endif*/
        } else {
            return boyi_search(n_w, n_b, new_board, rs, 2, a, b);
        }
    }
    num = 0;
    for (i = 0; i < SIZE; i++) {
        for (j = 0; j < SIZE; j++) {
            if (f == 1) {
                if (chessboard[i][j] != COLOR_(AI_COLOR) && chessboard[i][j] != BOTH)
/*#ifdef AI_COLOR_BLACK
				if (chessboard[i][j] != BLACK_&&chessboard[i][j] != BOTH)
#endif
#ifdef AI_COLOR_WHITE
				if (chessboard[i][j] != WHITE_&&chessboard[i][j] != BOTH)
#endif*/
                {
                    continue;
                }
            } else {
                if (board[i][j] != s - 3) {
                    continue;
                }
            }
            char rev = canrev(i, j, new_board, s, 1);
            new_board[i][j] = s;
            long arg_now;
            if (num != 0) {
                if (s == AI_COLOR)
/*#ifdef AI_COLOR_BLACK
				if (s == BLACK)
#endif
#ifdef AI_COLOR_WHITE
				if (s == WHITE)
#endif*/
                {
                    a = max(a, arg_now);
                } else {
                    b = min(b, arg_now);
                }
            }
            long arg_d = getarg(i, j, s);
            if (s == BLACK) {
                arg_now = boyi_search(n_w - rev, n_b + rev + 1, new_board, rs, 0, a - arg_d, b - arg_d) + arg_d;
            } else {
                arg_now = boyi_search(n_w + rev + 1, n_b - rev, new_board, rs, 0, a - arg_d, b - arg_d) + arg_d;
            }
            if (s == COLOR_rev(AI_COLOR) && arg_now <= a)//alpha
/*#ifdef AI_COLOR_BLACK
			if (s == WHITE&&arg_now <= a)//alpha
#endif
#ifdef AI_COLOR_WHITE
			if (s == BLACK&&arg_now <= a)//alpha
#endif*/
            {
                return a;
            }
            if (s == AI_COLOR && arg_now >= b)//beita
/*#ifdef AI_COLOR_BLACK
			if (s == BLACK&&arg_now >= b)//beita
#endif
#ifdef AI_COLOR_WHITE
			if (s == WHITE&&arg_now >= b)//beita
#endif*/
            {
                return b;
            }
            if (num == 0 || s == AI_COLOR && arg_now > arg_m || s == COLOR_rev(AI_COLOR) && arg_now < arg_m)
/*#ifdef AI_COLOR_BLACK
			if (num == 0 || s == BLACK &&arg_now > arg_m || s == WHITE&&arg_now < arg_m)
#endif
#ifdef AI_COLOR_WHITE
			if (num == 0 || s == BLACK &&arg_now < arg_m || s == WHITE&&arg_now > arg_m)
#endif*/
            {
                arg_m = arg_now;
                if (f == 1) {
                    boyi_max_x = i;
                    boyi_max_y = j;
                }
            }
            num++;
            memcpy(new_board, board, SIZE * SIZE);
        }
    }
    return arg_m;
}